

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall
pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::operator=
          (accessor<pybind11::detail::accessor_policies::generic_item> *this,
          pair<pybind11::object,_const_char_*> *value)

{
  handle local_38;
  PyObject *local_30;
  handle local_28;
  handle local_20;
  pair<pybind11::object,_const_char_*> *local_18;
  pair<pybind11::object,_const_char_*> *value_local;
  accessor<pybind11::detail::accessor_policies::generic_item> *this_local;
  
  local_20.m_ptr = (this->obj).m_ptr;
  local_28.m_ptr = (this->key).super_handle.m_ptr;
  local_18 = value;
  value_local = (pair<pybind11::object,_const_char_*> *)this;
  object_or_cast<std::pair<pybind11::object,_const_char_*>,_0>((detail *)&local_38,value);
  local_30 = local_38.m_ptr;
  accessor_policies::generic_item::set(local_20,local_28,local_38);
  object::~object((object *)&local_38);
  return;
}

Assistant:

void operator=(T &&value) && {
        Policy::set(obj, key, object_or_cast(std::forward<T>(value)));
    }